

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token,Value *decoded)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  uint uVar6;
  long *plVar7;
  double dVar8;
  Value local_278;
  undefined4 local_250;
  allocator<char> local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  istringstream local_1e8 [8];
  IStringStream is;
  allocator<char> local_51;
  string local_50 [8];
  String buffer;
  double value;
  Value *decoded_local;
  Token *token_local;
  Reader *this_local;
  
  buffer.field_2._8_8_ = 0;
  pcVar1 = token->start_;
  pcVar2 = token->end_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>(local_50,pcVar1,pcVar2,&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::__cxx11::istringstream::istringstream(local_1e8,local_50,_S_in);
  plVar7 = (long *)std::istream::operator>>(local_1e8,(double *)((long)&buffer.field_2 + 8));
  bVar5 = std::ios::operator!((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
  uVar3 = buffer.field_2._8_8_;
  if ((bVar5 & 1) != 0) {
    dVar8 = std::numeric_limits<double>::max();
    uVar4 = buffer.field_2._8_8_;
    if (((double)uVar3 != dVar8) || (NAN((double)uVar3) || NAN(dVar8))) {
      dVar8 = std::numeric_limits<double>::lowest();
      if (((double)uVar4 != dVar8) || (NAN((double)uVar4) || NAN(dVar8))) {
        uVar6 = std::isinf((double)buffer.field_2._8_8_);
        if ((uVar6 & 1) == 0) {
          pcVar1 = token->start_;
          pcVar2 = token->end_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    ((string *)&local_248,pcVar1,pcVar2,&local_249);
          std::operator+(&local_228,"\'",&local_248);
          std::operator+(&local_208,&local_228,"\' is not a number.");
          this_local._7_1_ = addError(this,&local_208,token,(Location)0x0);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
          goto LAB_00a96207;
        }
      }
      else {
        dVar8 = std::numeric_limits<double>::infinity();
        buffer.field_2._8_8_ = -dVar8;
      }
    }
    else {
      buffer.field_2._8_8_ = std::numeric_limits<double>::infinity();
    }
  }
  Value::Value(&local_278,(double)buffer.field_2._8_8_);
  Value::operator=(decoded,&local_278);
  Value::~Value(&local_278);
  this_local._7_1_ = true;
LAB_00a96207:
  local_250 = 1;
  std::__cxx11::istringstream::~istringstream(local_1e8);
  std::__cxx11::string::~string(local_50);
  return this_local._7_1_;
}

Assistant:

bool Reader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  String buffer(token.start_, token.end_);
  IStringStream is(buffer);
  if (!(is >> value)) {
    if (value == std::numeric_limits<double>::max())
      value = std::numeric_limits<double>::infinity();
    else if (value == std::numeric_limits<double>::lowest())
      value = -std::numeric_limits<double>::infinity();
    else if (!std::isinf(value))
      return addError(
        "'" + String(token.start_, token.end_) + "' is not a number.", token);
  }
  decoded = value;
  return true;
}